

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

bool __thiscall
absl::lts_20240722::container_internal::
btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
::Equals(btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
         *this,const_iterator other)

{
  bool bVar1;
  bool local_33;
  anon_class_1_0_00000001 local_21;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
  *local_20;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
  *this_local;
  const_iterator other_local;
  
  this_local = (btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                *)other.node_;
  other_local.node_._0_4_ = other.position_;
  if (((this->node_ ==
        (btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
         *)0x0) &&
      (this_local ==
       (btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
        *)0x0)) ||
     ((bVar1 = false,
      this->node_ !=
      (btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
       *)0x0 && (bVar1 = false,
                this_local !=
                (btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                 *)0x0)))) {
    bVar1 = true;
  }
  local_20 = this;
  if (!bVar1) {
    Equals::anon_class_1_0_00000001::operator()(&local_21);
  }
  bVar1 = AreNodesFromSameContainer<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>>
                    (this->node_,
                     (btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                      *)this_local);
  if (bVar1) {
    btree_iterator_generation_info_disabled::assert_valid_generation(this->node_);
    btree_iterator_generation_info_disabled::assert_valid_generation(this_local);
    local_33 = false;
    if ((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
         *)this->node_ == this_local) {
      local_33 = this->position_ == (int)other_local.node_;
    }
    return local_33;
  }
  __assert_fail("AreNodesFromSameContainer(node_, other.node_) && \"Comparing iterators from different containers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                ,0x4e2,
                "bool absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>>, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry &, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry *>::Equals(const const_iterator) const [Node = absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>>, Reference = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry &, Pointer = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry *]"
               );
}

Assistant:

bool Equals(const const_iterator other) const {
    ABSL_HARDENING_ASSERT(((node_ == nullptr && other.node_ == nullptr) ||
                           (node_ != nullptr && other.node_ != nullptr)) &&
                          "Comparing default-constructed iterator with "
                          "non-default-constructed iterator.");
    // Note: we use assert instead of ABSL_HARDENING_ASSERT here because this
    // changes the complexity of Equals from O(1) to O(log(N) + log(M)) where
    // N/M are sizes of the containers containing node_/other.node_.
    assert(AreNodesFromSameContainer(node_, other.node_) &&
           "Comparing iterators from different containers.");
    assert_valid_generation(node_);
    other.assert_valid_generation(other.node_);
    return node_ == other.node_ && position_ == other.position_;
  }